

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O3

upb_MiniTableExtension *
upb_ExtensionRegistry_Lookup(upb_ExtensionRegistry *r,upb_MiniTable *t,uint32_t num)

{
  _Bool _Var1;
  upb_value v;
  char buf [12];
  upb_value local_18;
  upb_MiniTable *local_10;
  uint32_t local_8;
  
  local_10 = t;
  local_8 = num;
  _Var1 = upb_strtable_lookup2(&r->exts,(char *)&local_10,0xc,&local_18);
  if (!_Var1) {
    local_18.val = 0;
  }
  return (upb_MiniTableExtension *)local_18.val;
}

Assistant:

const upb_MiniTableExtension* upb_ExtensionRegistry_Lookup(
    const upb_ExtensionRegistry* r, const upb_MiniTable* t, uint32_t num) {
  char buf[EXTREG_KEY_SIZE];
  upb_value v;
  extreg_key(buf, t, num);
  if (upb_strtable_lookup2(&r->exts, buf, EXTREG_KEY_SIZE, &v)) {
    return upb_value_getconstptr(v);
  } else {
    return NULL;
  }
}